

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O0

uint32_t __thiscall spvtools::val::ValidationState_t::GetTypeId(ValidationState_t *this,uint32_t id)

{
  Instruction *this_00;
  undefined4 local_24;
  Instruction *inst;
  uint32_t id_local;
  ValidationState_t *this_local;
  
  this_00 = FindDef(this,id);
  if (this_00 == (Instruction *)0x0) {
    local_24 = 0;
  }
  else {
    local_24 = Instruction::type_id(this_00);
  }
  return local_24;
}

Assistant:

uint32_t ValidationState_t::GetTypeId(uint32_t id) const {
  const Instruction* inst = FindDef(id);
  return inst ? inst->type_id() : 0;
}